

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.cpp
# Opt level: O0

void __thiscall encoder::count_bytes(encoder *this)

{
  undefined1 uVar1;
  char *pcVar2;
  tree *in_RDI;
  vector<char,_std::allocator<char>_> buffer;
  allocator_type *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  allocator<char> local_21 [33];
  
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)in_RDI,
             CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa0
            );
  std::allocator<char>::~allocator(local_21);
  while( true ) {
    uVar1 = std::ios::operator_cast_to_bool
                      ((ios *)(&(((_Vector_base<char,_std::allocator<char>_> *)&in_RDI->SIGMA_SIZE)
                                ->_M_impl).super__Tp_alloc_type +
                              *(long *)(*(long *)&((_Vector_base<char,_std::allocator<char>_> *)
                                                  &in_RDI->SIGMA_SIZE)->_M_impl + -0x18)));
    if (!(bool)uVar1) break;
    pcVar2 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x1168af);
    std::istream::read((char *)in_RDI,(long)pcVar2);
    std::unique_ptr<tree,_std::default_delete<tree>_>::operator->
              ((unique_ptr<tree,_std::default_delete<tree>_> *)0x1168d6);
    std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x1168e5);
    in_stack_ffffffffffffffa0 = (allocator_type *)std::istream::gcount();
    tree::update_dict(in_RDI,(char *)CONCAT17(uVar1,in_stack_ffffffffffffffa8),
                      (size_t)in_stack_ffffffffffffffa0);
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void encoder::count_bytes() {
    std::vector<char> buffer(buffer_size);
    while (src_file) {
        src_file.read(buffer.data(), buffer_size);
        h_tree->update_dict(buffer.data(), static_cast<size_t>(src_file.gcount()));
    }
}